

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

float_t __thiscall djb::beckmann::qf2(beckmann *this,float_t u,float_t zi,float_t z_i)

{
  int iVar1;
  float_t fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float_t fVar7;
  float fVar8;
  float fVar9;
  
  if ((u != 0.0) || (NAN(u))) {
    if ((u != 1.0) || (NAN(u))) {
      fVar3 = zi / z_i;
      fVar4 = erff(fVar3);
      fVar5 = acosf(zi);
      fVar9 = fVar4 + 1.0;
      fVar5 = powf(1.0 - u,((fVar5 * -0.0594 + 0.4265) * fVar5 + -0.876) * fVar5 + 1.0);
      fVar5 = fVar5 * fVar9;
      fVar6 = (z_i / zi) * 0.56418955;
      if (0.0 < z_i) {
        fVar3 = expf(-fVar3 * fVar3);
        fVar9 = fVar9 + fVar3 * fVar6;
      }
      fVar2 = fVar4 - fVar5;
      fVar3 = -1.0;
      iVar1 = 9;
      do {
        fVar5 = (fVar4 + fVar3) * 0.5;
        if (fVar3 <= fVar2 && fVar2 <= fVar4) {
          fVar5 = fVar2;
        }
        fVar7 = erfinv(fVar5);
        fVar8 = expf(fVar7 * -fVar7);
        fVar8 = (fVar8 * fVar6 + fVar5 + 1.0) * (1.0 / fVar9) + -u;
        fVar2 = fVar5;
        if (ABS(fVar8) < 1e-05) break;
        if (fVar8 <= 0.0) {
          fVar3 = fVar5;
        }
        fVar4 = (float)(~-(uint)(0.0 < fVar8) & (uint)fVar4 | -(uint)(0.0 < fVar8) & (uint)fVar5);
        fVar2 = fVar5 - fVar8 / ((-fVar7 * (z_i / zi) + 1.0) * (1.0 / fVar9));
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      fVar2 = erfinv(fVar2);
      return fVar2;
    }
    fVar2 = INFINITY;
  }
  else {
    fVar2 = -INFINITY;
  }
  return fVar2;
}

Assistant:

float_t beckmann::qf2(float_t u, float_t zi, float_t z_i) const
{
	if (u == 0)
		return -std::numeric_limits<float>::infinity();
	else if (u == 1)
		return +std::numeric_limits<float>::infinity();
	else {
		const float_t sqrt_pi_inv = 1 / sqrt(m_pi());

		/* The original inversion routine from the paper contained
		   discontinuities, which causes issues for QMC integration
		   and techniques like Kelemen-style MLT. The following code
		   performs a numerical inversion with better behavior */
		float_t cti = zi / z_i;
		float_t tti = z_i / zi;

		/* Search interval -- everything is parameterized
		   in the erf() domain */
		float_t a = -1, c = std::erf(cti);

		/* Start with a good initial guess */
		/* We can do better (inverse of an approximation computed in Mathematica) */
		float_t ti = acos(zi);
		float_t fit = 1 + ti * (-0.876f + ti * (0.4265f - 0.0594f * ti));
		float_t b = c - (1 + c) * std::pow(1 - u, fit);

		/* Normalization factor for the CDF */
		float_t nrm;
		if (z_i > 0)
			nrm = 1 / (1 + c + sqrt_pi_inv * tti * exp(-sqr(cti)));
		else
			nrm = 1 / (1 + c);

		int it = 0;
		while (++it < 10) {
			/* Bisection criterion -- the oddly-looking
			   boolean expression are intentional to check
			   for NaNs at little additional cost */
			if (!(b >= a && b <= c))
				b = 0.5f * (a + c);

			/* Evaluate the CDF and its derivative
			   (i.e. the density function) */
			float_t invErf = erfinv(b);
			float_t value = nrm * (1 + b + sqrt_pi_inv *
				tti * std::exp(-invErf * invErf)) - u;
			float_t derivative = nrm * (1 - invErf * tti);

			if (fabs(value) < 1e-5f)
				break;

			/* Update bisection intervals */
			if (value > 0)
				c = b;
			else
				a = b;

			b -= value / derivative;
		}

		/* Now convert back into a slope value */
		return erfinv(b);
	}
}